

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_peer_id.cpp
# Opt level: O1

peer_id * libtorrent::aux::generate_peer_id(peer_id *__return_storage_ptr__,session_settings *sett)

{
  pointer pcVar1;
  string *psVar2;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar3;
  long lVar4;
  span<char> dest;
  string print;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  (__return_storage_ptr__->m_number)._M_elems[0] = 0;
  (__return_storage_ptr__->m_number)._M_elems[1] = 0;
  (__return_storage_ptr__->m_number)._M_elems[2] = 0;
  (__return_storage_ptr__->m_number)._M_elems[3] = 0;
  (__return_storage_ptr__->m_number)._M_elems[4] = 0;
  psVar2 = session_settings::get_str_abi_cxx11_(sett,10);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_38 = local_28;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + psVar2->_M_string_length);
  lVar3 = extraout_RDX;
  if (0x14 < local_30) {
    ::std::__cxx11::string::resize((ulong)&local_38,'\x14');
    lVar3 = extraout_RDX_00;
  }
  if (0 < local_30) {
    lVar3 = local_30 + 1;
    lVar4 = 0;
    do {
      *(undefined1 *)((long)(__return_storage_ptr__->m_number)._M_elems + lVar4) =
           *(undefined1 *)((long)local_38 + lVar4);
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + 1;
    } while (1 < lVar3);
  }
  if (local_30 < 0x14) {
    dest.m_ptr = (char *)(0x14 - local_30);
    dest.m_len = lVar3;
    url_random((aux *)((long)(__return_storage_ptr__->m_number)._M_elems + local_30),dest);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

peer_id generate_peer_id(session_settings const& sett)
{
	peer_id ret;
	std::string print = sett.get_str(settings_pack::peer_fingerprint);
	if (std::ptrdiff_t(print.size()) > ret.size())
		print.resize(std::size_t(ret.size()));

	// the client's fingerprint
	std::copy(print.begin(), print.end(), ret.begin());
	if (std::ptrdiff_t(print.size()) < ret.size())
		url_random(span<char>(ret).subspan(std::ptrdiff_t(print.length())));
	return ret;
}